

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t zetGetDebugProcAddrTable(ze_api_version_t version,zet_debug_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (zet_debug_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnAttach = driver::zetDebugAttach;
      pDdiTable->pfnDetach = driver::zetDebugDetach;
      pDdiTable->pfnReadEvent = driver::zetDebugReadEvent;
      pDdiTable->pfnAcknowledgeEvent = driver::zetDebugAcknowledgeEvent;
      pDdiTable->pfnInterrupt = driver::zetDebugInterrupt;
      pDdiTable->pfnResume = driver::zetDebugResume;
      pDdiTable->pfnReadMemory = driver::zetDebugReadMemory;
      pDdiTable->pfnWriteMemory = driver::zetDebugWriteMemory;
      pDdiTable->pfnGetRegisterSetProperties = driver::zetDebugGetRegisterSetProperties;
      pDdiTable->pfnReadRegisters = driver::zetDebugReadRegisters;
      pDdiTable->pfnWriteRegisters = driver::zetDebugWriteRegisters;
      pDdiTable->pfnGetThreadRegisterSetProperties = driver::zetDebugGetThreadRegisterSetProperties;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetDebugProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_debug_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnAttach                                 = driver::zetDebugAttach;

    pDdiTable->pfnDetach                                 = driver::zetDebugDetach;

    pDdiTable->pfnReadEvent                              = driver::zetDebugReadEvent;

    pDdiTable->pfnAcknowledgeEvent                       = driver::zetDebugAcknowledgeEvent;

    pDdiTable->pfnInterrupt                              = driver::zetDebugInterrupt;

    pDdiTable->pfnResume                                 = driver::zetDebugResume;

    pDdiTable->pfnReadMemory                             = driver::zetDebugReadMemory;

    pDdiTable->pfnWriteMemory                            = driver::zetDebugWriteMemory;

    pDdiTable->pfnGetRegisterSetProperties               = driver::zetDebugGetRegisterSetProperties;

    pDdiTable->pfnReadRegisters                          = driver::zetDebugReadRegisters;

    pDdiTable->pfnWriteRegisters                         = driver::zetDebugWriteRegisters;

    pDdiTable->pfnGetThreadRegisterSetProperties         = driver::zetDebugGetThreadRegisterSetProperties;

    return result;
}